

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_e5e95::TransformSelectorAt::~TransformSelectorAt(TransformSelectorAt *this)

{
  TransformSelectorIndexes::~TransformSelectorIndexes(&this->super_TransformSelectorIndexes);
  operator_delete(this,0x40);
  return;
}

Assistant:

TransformSelectorAt(std::vector<index_type> const& indexes)
    : TransformSelectorIndexes("AT", indexes)
  {
  }